

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O3

int fprint<int&>(FILE *out,char *fmt,int *args)

{
  size_t sVar1;
  string str;
  string local_30;
  
  stringformat<int&>(&local_30,fmt,args);
  sVar1 = fwrite(local_30._M_dataplus._M_p,local_30._M_string_length,1,(FILE *)out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return (int)sVar1;
}

Assistant:

int fprint(FILE *out, const char *fmt, ARGS&&...args)
{
    auto str = stringformat(fmt, std::forward<ARGS>(args)...);
    return fwrite(str.c_str(), str.size(), 1, out);
}